

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverageOptionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageOptionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ExpressionSyntax *args_1,Token *args_2)

{
  Token semi;
  CoverageOptionSyntax *this_00;
  
  this_00 = (CoverageOptionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverageOptionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CoverageOptionSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  slang::syntax::CoverageOptionSyntax::CoverageOptionSyntax(this_00,args,args_1,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }